

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::anon_unknown_14::matchesAny
               (char *name,vector<doctest::String,_std::allocator<doctest::String>_> *filters,
               bool matchEmpty,bool caseSensitive)

{
  byte bVar1;
  char cVar2;
  pointer pSVar3;
  anon_union_24_2_13149d16_for_String_2 *paVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  pointer pSVar10;
  pointer pSVar11;
  char cVar12;
  uint __c;
  pointer local_48;
  
  pSVar10 = (filters->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar3 = (filters->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar10 == pSVar3 && matchEmpty) {
    return true;
  }
LAB_0010b087:
  if (pSVar10 == pSVar3) {
    return false;
  }
  pbVar7 = (byte *)name;
  pSVar11 = pSVar10;
  local_48 = pSVar10;
  if ((pSVar10->field_0).buf[0x17] < '\0') {
    pSVar11 = (pointer)(pSVar10->field_0).data.ptr;
    local_48 = pSVar11;
  }
  while( true ) {
    __c = (uint)(char)*pbVar7;
    pbVar8 = (byte *)name;
    if (__c == 0) break;
    bVar1 = (pSVar11->field_0).buf[0];
    if ((char)bVar1 == 0x2a) break;
    if (caseSensitive) {
      if (bVar1 != 0x3f && bVar1 != *pbVar7) goto LAB_0010b197;
    }
    else {
      iVar5 = tolower((int)(char)bVar1);
      iVar6 = tolower(__c);
      if ((bVar1 != 0x3f) && (iVar5 != iVar6)) goto LAB_0010b197;
    }
    pbVar7 = pbVar7 + 1;
    pSVar11 = (pointer)((long)&pSVar11->field_0 + 1);
  }
  do {
    cVar12 = (char)__c;
    if (cVar12 == '\0') break;
    cVar2 = (pSVar11->field_0).buf[0];
    if (cVar2 == 0x2a) {
      if ((pSVar11->field_0).buf[1] == '\0') {
        return true;
      }
      local_48 = (pointer)((long)&pSVar11->field_0 + 1);
      pbVar9 = pbVar7 + 1;
      pSVar11 = local_48;
    }
    else {
      if (caseSensitive) {
        if (cVar2 != '?' && cVar2 != cVar12) {
LAB_0010b169:
          pbVar9 = pbVar8 + 1;
          pbVar7 = pbVar8;
          pSVar11 = local_48;
          goto LAB_0010b17c;
        }
      }
      else {
        iVar5 = tolower((int)cVar2);
        iVar6 = tolower((int)cVar12);
        if ((cVar2 != '?') && (iVar5 != iVar6)) goto LAB_0010b169;
      }
      pbVar7 = pbVar7 + 1;
      pbVar9 = pbVar8;
      pSVar11 = (pointer)((long)&pSVar11->field_0 + 1);
    }
LAB_0010b17c:
    __c = (uint)*pbVar7;
    pbVar8 = pbVar9;
  } while( true );
  do {
    paVar4 = &pSVar11->field_0;
    pSVar11 = (pointer)((long)&pSVar11->field_0 + 1);
  } while (paVar4->buf[0] == '*');
  if (paVar4->buf[0] == '\0') {
    return true;
  }
LAB_0010b197:
  pSVar10 = pSVar10 + 1;
  goto LAB_0010b087;
}

Assistant:

bool matchesAny(const char* name, const std::vector<String>& filters, bool matchEmpty,
                    bool caseSensitive) {
        if(filters.empty() && matchEmpty)
            return true;
        for(auto& curr : filters)
            if(wildcmp(name, curr.c_str(), caseSensitive))
                return true;
        return false;
    }